

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O2

void __thiscall
LargeGapGrayCode::createCodeFromTheorem2(LargeGapGrayCode *this,int n,int m,int r,int s,int t)

{
  pointer *v;
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  LargeGapGrayCode *pLVar3;
  LargeGapGrayCode *this_00;
  double dVar4;
  stringstream local_248 [8];
  stringstream ss;
  ostream local_238 [376];
  string local_c0 [32];
  undefined1 local_a0 [8];
  vector<char,_std::allocator<char>_> P;
  vector<char,_std::allocator<char>_> Q;
  vector<char,_std::allocator<char>_> Z;
  vector<int,_std::allocator<int>_> t_1;
  
  pLVar3 = (LargeGapGrayCode *)CONCAT44(in_register_00000034,n);
  if ((((m <= n) && (0 < r && r <= m)) && ((s & 1U) != 0 && 0 < s)) && ((t & 1U) != 0 && 0 < t)) {
    dVar4 = exp2((double)r);
    if (((dVar4 == (double)(s + t)) && (!NAN(dVar4) && !NAN((double)(s + t)))) &&
       (iVar1 = m + n + r, iVar1 < 0x15)) {
      createPVector((vector<char,_std::allocator<char>_> *)local_a0,pLVar3,s,t);
      dVar4 = ldexp(1.0,n);
      this_00 = (LargeGapGrayCode *)
                &P.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
      multiCopyVector((vector<char,_std::allocator<char>_> *)this_00,pLVar3,
                      (vector<char,_std::allocator<char>_> *)local_a0,(int)dVar4);
      v = &P.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      pLVar3 = (LargeGapGrayCode *)v;
      replaceLastBWithC(this_00,(vector<char,_std::allocator<char>_> *)v);
      dVar4 = ldexp(1.0,m);
      multiCopyVector((vector<char,_std::allocator<char>_> *)
                      &Q.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,pLVar3,
                      (vector<char,_std::allocator<char>_> *)v,(int)dVar4);
      createTransitionSequenceTheorem2
                ((vector<int,_std::allocator<int>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,this,n,m,r,
                 (vector<char,_std::allocator<char>_> *)
                 &Q.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      iVar1 = iVar1 + -1;
      std::vector<int,_std::allocator<int>_>::operator=
                ((this->m_transitionSequences).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar1,
                 (vector<int,_std::allocator<int>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::__cxx11::stringstream::stringstream(local_248);
      poVar2 = std::operator<<(local_238,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
      poVar2 = std::operator<<(poVar2," + ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,m);
      poVar2 = std::operator<<(poVar2," + ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,r);
      std::operator<<(poVar2,")");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((this->m_creationMethod).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar1),local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::stringstream::~stringstream(local_248);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 &Z.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)
                 &Q.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)
                 &P.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_a0);
      return;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Constraints for Theorem 2 are not satisfied.");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void LargeGapGrayCode::createCodeFromTheorem2(int n, int m, int r, int s, int t)
{
	if(n >= m && m >= r && r >= 1 && isOddPositive(s) && isOddPositive(t) && (s+t) == pow(2,r) && (n+m+r <= maxBitWidth)) {
		std::vector<char> P = createPVector(s, t);
		std::vector<char> Q = multiCopyVector(P, pow(2, n));
		replaceLastBWithC(Q);
		std::vector<char> Z = multiCopyVector(Q, pow(2, m));
		std::vector<int> t = createTransitionSequenceTheorem2(n, m, r, Z);
		m_transitionSequences[n+m+r-1] = t;
		std::stringstream ss;
		ss << "(" << n << " + " << m << " + " << r << ")";
		m_creationMethod[n+m+r-1] = ss.str();
	}
	else {
		std::cout << "Constraints for Theorem 2 are not satisfied." << std::endl;
	}
}